

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

void xemmai::ast::anon_unknown_11::f_emit_block_without_value
               (t_emit *a_emit,
               vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
               *a_nodes)

{
  pointer puVar1;
  t_node *ptVar2;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p;
  pointer puVar3;
  
  puVar1 = (a_nodes->
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (a_nodes->
                super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    ptVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
             _M_t.
             super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
             .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
    (*ptVar2->_vptr_t_node[3])(ptVar2,a_emit,0,0,1);
  }
  return;
}

Assistant:

void f_emit_block_without_value(t_emit& a_emit, const std::vector<std::unique_ptr<t_node>>& a_nodes)
{
	for (auto& p : a_nodes) p->f_emit(a_emit, false, false, true);
}